

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_rate.c
# Opt level: O0

double inform_entropy_rate(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  void *__ptr;
  double dVar3;
  undefined1 auVar4 [16];
  double er;
  inform_dist histories;
  inform_dist states;
  uint32_t *data;
  size_t total_size;
  size_t histories_size;
  size_t states_size;
  size_t N;
  inform_error *err_local;
  size_t k_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  if (_Var1) {
    series_local = (int *)0x7ff8000000000000;
  }
  else {
    auVar4._8_4_ = (int)(k >> 0x20);
    auVar4._0_8_ = k;
    auVar4._12_4_ = 0x45300000;
    dVar3 = pow((double)b,
                (auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar3 = (double)b * dVar3;
    uVar2 = (ulong)dVar3;
    uVar2 = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    __ptr = calloc(uVar2 + (long)(uVar2 / (ulong)(long)b),4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x7ff8000000000000;
    }
    else {
      er = (double)((long)__ptr + uVar2 * 4);
      histories.histogram = (uint32_t *)(uVar2 / (ulong)(long)b);
      histories.size = n * (m - k);
      histories.counts = (uint64_t)__ptr;
      accumulate_observations(series,n,m,b,k,(inform_dist *)&histories.counts,(inform_dist *)&er);
      series_local = (int *)inform_shannon_ce((inform_dist *)&histories.counts,(inform_dist *)&er,
                                              2.0);
      free(__ptr);
    }
  }
  return (double)series_local;
}

Assistant:

double inform_entropy_rate(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const N = n * (m - k);

    size_t const states_size = (size_t) (b * pow((double) b, (double) k));
    size_t const histories_size = states_size / b;
    size_t const total_size = states_size + histories_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };

    accumulate_observations(series, n, m, b, k, &states, &histories);

    double er = inform_shannon_ce(&states, &histories, 2.0);

    free(data);

    return er;
}